

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmLinkItem * __thiscall
cmGeneratorTarget::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmGeneratorTarget *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *name
          ,cmLocalGenerator *lg,string *linkFeature)

{
  bool bVar1;
  TargetType TVar2;
  ostream *poVar3;
  string *psVar4;
  cmake *this_00;
  cmGeneratorTarget *this_01;
  cmListFileBacktrace bt;
  TargetOrString resolved;
  ostringstream w;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  _Stack_2c8;
  TargetOrString local_2b8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_290;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_280;
  string local_270;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_250;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostream local_1a0;
  
  this_01 = (cmGeneratorTarget *)&name->Backtrace;
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_2c8,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)this_01);
  ResolveTargetReference(&local_2b8,this_01,&name->Value,lg);
  if (local_2b8.Target == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)&local_1c0,(string *)&local_2b8);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_250,&_Stack_2c8);
    std::__cxx11::string::string((string *)&local_1e0,(string *)linkFeature);
    cmLinkItem::cmLinkItem
              (__return_storage_ptr__,&local_1c0,false,(cmListFileBacktrace *)&local_250,&local_1e0)
    ;
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250._M_refcount);
    psVar4 = &local_1c0;
LAB_0049bfb4:
    std::__cxx11::string::~string((string *)psVar4);
  }
  else {
    bVar1 = IsDeprecated(local_2b8.Target);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      poVar3 = std::operator<<(&local_1a0,"The library that is being linked to, ");
      psVar4 = GetName_abi_cxx11_(local_2b8.Target);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,
                               ", is marked as being deprecated by the owner.  The message provided by the developer is: \n"
                              );
      GetDeprecation_abi_cxx11_(&local_270,local_2b8.Target);
      poVar3 = std::operator<<(poVar3,(string *)&local_270);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_270);
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_270,(cmListFileBacktrace *)&_Stack_2c8);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    }
    TVar2 = GetType(local_2b8.Target);
    if (TVar2 == EXECUTABLE) {
      bVar1 = IsExecutableWithExports(local_2b8.Target);
      if (!bVar1) {
        psVar4 = GetName_abi_cxx11_(local_2b8.Target);
        std::__cxx11::string::string((string *)&local_200,(string *)psVar4);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_280,&_Stack_2c8);
        std::__cxx11::string::string((string *)&local_220,(string *)linkFeature);
        cmLinkItem::cmLinkItem
                  (__return_storage_ptr__,&local_200,false,(cmListFileBacktrace *)&local_280,
                   &local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
        psVar4 = &local_200;
        goto LAB_0049bfb4;
      }
    }
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_290,&_Stack_2c8);
    std::__cxx11::string::string((string *)&local_240,(string *)linkFeature);
    cmLinkItem::cmLinkItem
              (__return_storage_ptr__,local_2b8.Target,false,(cmListFileBacktrace *)&local_290,
               &local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290._M_refcount);
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2c8._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmGeneratorTarget::ResolveLinkItem(
  BT<std::string> const& name, cmLocalGenerator const* lg,
  std::string const& linkFeature) const
{
  auto bt = name.Backtrace;
  TargetOrString resolved = this->ResolveTargetReference(name.Value, lg);

  if (!resolved.Target) {
    return cmLinkItem(resolved.String, false, bt, linkFeature);
  }

  // Check deprecation, issue message with `bt` backtrace.
  if (resolved.Target->IsDeprecated()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The library that is being linked to, "  << resolved.Target->GetName() <<
      ", is marked as being deprecated by the owner.  The message provided by "
      "the developer is: \n" << resolved.Target->GetDeprecation() << "\n";
    /* clang-format on */
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), bt);
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (resolved.Target->GetType() == cmStateEnums::EXECUTABLE &&
      !resolved.Target->IsExecutableWithExports()) {
    return cmLinkItem(resolved.Target->GetName(), false, bt, linkFeature);
  }

  return cmLinkItem(resolved.Target, false, bt, linkFeature);
}